

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

ly_bool lyd_is_default(lyd_node *node)

{
  lysc_node *plVar1;
  int iVar2;
  ly_ctx *local_68;
  void *local_58;
  ly_ctx *local_48;
  void *local_38;
  uint64_t u;
  lyd_node_term *term;
  lysc_node_leaflist *llist;
  lysc_node_leaf *leaf;
  lyd_node *node_local;
  
  if ((node->schema->nodetype & 0xc) == 0) {
    node_local._7_1_ = '\0';
  }
  else if (node->schema->nodetype == 4) {
    plVar1 = node->schema;
    if (plVar1[1].prev == (lysc_node *)0x0) {
      node_local._7_1_ = '\0';
    }
    else {
      if (node->schema == (lysc_node *)0x0) {
        local_48 = (ly_ctx *)node[2].schema;
      }
      else {
        local_48 = node->schema->module->ctx;
      }
      iVar2 = (*(code *)(plVar1[1].parent)->parent->next)(local_48,node + 1,plVar1[1].prev);
      if (iVar2 == 0) {
        node_local._7_1_ = '\x01';
      }
      else {
LAB_00139369:
        node_local._7_1_ = '\0';
      }
    }
  }
  else {
    plVar1 = node->schema;
    if (plVar1[1].prev == (lysc_node *)0x0) {
      node_local._7_1_ = '\0';
    }
    else {
      local_38 = (void *)0x0;
      while( true ) {
        if (plVar1[1].prev == (lysc_node *)0x0) {
          local_58 = (void *)0x0;
        }
        else {
          local_58 = plVar1[1].prev[-1].priv;
        }
        if (local_58 <= local_38) goto LAB_00139369;
        if (node->schema == (lysc_node *)0x0) {
          local_68 = (ly_ctx *)node[2].schema;
        }
        else {
          local_68 = node->schema->module->ctx;
        }
        iVar2 = (*(code *)(plVar1[1].parent)->parent->next)
                          (local_68,node + 1,
                           *(undefined8 *)((plVar1[1].prev)->hash + (long)local_38 * 8 + -4));
        if (iVar2 == 0) break;
        local_38 = (void *)((long)local_38 + 1);
      }
      node_local._7_1_ = '\x01';
    }
  }
  return node_local._7_1_;
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_is_default(const struct lyd_node *node)
{
    const struct lysc_node_leaf *leaf;
    const struct lysc_node_leaflist *llist;
    const struct lyd_node_term *term;
    LY_ARRAY_COUNT_TYPE u;

    if (!(node->schema->nodetype & LYD_NODE_TERM)) {
        return 0;
    }

    term = (const struct lyd_node_term *)node;

    if (node->schema->nodetype == LYS_LEAF) {
        leaf = (const struct lysc_node_leaf *)node->schema;
        if (!leaf->dflt) {
            return 0;
        }

        /* compare with the default value */
        if (!leaf->type->plugin->compare(LYD_CTX(node), &term->value, leaf->dflt)) {
            return 1;
        }
    } else {
        llist = (const struct lysc_node_leaflist *)node->schema;
        if (!llist->dflts) {
            return 0;
        }

        LY_ARRAY_FOR(llist->dflts, u) {
            /* compare with each possible default value */
            if (!llist->type->plugin->compare(LYD_CTX(node), &term->value, llist->dflts[u])) {
                return 1;
            }
        }
    }

    return 0;
}